

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d4e6f::AEADTest_WycheproofAESGCMSIV_Test::~AEADTest_WycheproofAESGCMSIV_Test
          (AEADTest_WycheproofAESGCMSIV_Test *this)

{
  AEADTest_WycheproofAESGCMSIV_Test *this_local;
  
  ~AEADTest_WycheproofAESGCMSIV_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AEADTest, WycheproofAESGCMSIV) {
  FileTestGTest("third_party/wycheproof_testvectors/aes_gcm_siv_test.txt",
                [](FileTest *t) {
                  std::string key_size_str;
                  ASSERT_TRUE(t->GetInstruction(&key_size_str, "keySize"));
                  const EVP_AEAD *aead;
                  switch (atoi(key_size_str.c_str())) {
                    case 128:
                      aead = EVP_aead_aes_128_gcm_siv();
                      break;
                    case 256:
                      aead = EVP_aead_aes_256_gcm_siv();
                      break;
                    default:
                      FAIL() << "Unknown key size: " << key_size_str;
                  }

                  RunWycheproofTestCase(t, aead);
                });
}